

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Student.cpp
# Opt level: O3

ostream * L14_2::operator<<(ostream *os,Student *stu)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"Scores for ",0xb);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(stu->super_string)._M_dataplus._M_p,(stu->super_string)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,":\n",2);
  poVar1 = Student::output(stu,os);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream &os, const Student &stu) {
        os << "Scores for " << (std::string &)stu << ":\n";
        stu.output(os);
        return os;
    }